

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack8.h
# Opt level: O0

void ncnn::deconvolution_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  long *plVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  long lVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  int iVar76;
  int iVar77;
  undefined8 *puVar78;
  long lVar79;
  long lVar80;
  long lVar81;
  long lVar82;
  long lVar83;
  long lVar84;
  long lVar85;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  undefined4 in_stack_00000034;
  __m256 _w7;
  __m256 _w6;
  __m256 _w5;
  __m256 _w4;
  __m256 _w3;
  __m256 _w2;
  __m256 _w1;
  __m256 _w0;
  __m256 _val7;
  __m256 _val6;
  __m256 _val5;
  __m256 _val4;
  __m256 _val3;
  __m256 _val2;
  __m256 _val1;
  __m256 _val0;
  int k;
  float *sptr;
  int sx;
  int sxs;
  int x;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m256 _sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m256 _b;
  __m256 _a;
  __m256 max;
  __m256 min;
  __m256 neg;
  __m256 pos;
  __m256 one;
  __m256 one_7;
  __m256 pow2n_1;
  __m256 y_2;
  __m256 mask_1;
  __m256 one_2;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask;
  __m256 one_1;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  __m256 two;
  __m256 one_4;
  __m256 one_5;
  __m256 pow2n_2;
  __m256 y_4;
  __m256 mask_3;
  __m256 one_6;
  __m256i imm0_3;
  __m256 fx_2;
  __m256 tmp_3;
  imm_xmm_union u_17;
  imm_xmm_union u_16;
  imm_xmm_union u_15;
  __m256i ret_6;
  __m128i y2_3;
  __m128i y1_3;
  __m128i x2_6;
  __m128i x1_6;
  imm_xmm_union u_19;
  imm_xmm_union u_18;
  __m256i ret_7;
  __m128i x2_7;
  __m128i x1_7;
  __m256 y_3;
  __m256 z;
  __m256 tmp_2;
  __m256 mask_2;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_3;
  __m256i imm0_2;
  imm_xmm_union u_11;
  imm_xmm_union u_10;
  __m256i ret_4;
  __m128i x2_4;
  __m128i x1_4;
  imm_xmm_union u_14;
  imm_xmm_union u_13;
  imm_xmm_union u_12;
  __m256i ret_5;
  __m128i y2_2;
  __m128i y1_2;
  __m128i x2_5;
  __m128i x1_5;
  ulong uStack_5a58;
  int local_5450;
  int local_5444;
  int local_53f4;
  long local_53a8;
  undefined8 local_53a0;
  undefined8 uStack_5398;
  undefined8 uStack_5390;
  undefined8 uStack_5388;
  int local_536c;
  int local_5368;
  undefined1 (*local_52f8) [32];
  int local_52ec;
  undefined1 local_4a00 [8];
  undefined8 uStack_49f8;
  undefined8 uStack_49f0;
  undefined8 uStack_49e8;
  ulong uStack_4978;
  float local_4920;
  float fStack_491c;
  float fStack_4918;
  float fStack_4914;
  float fStack_4910;
  float fStack_490c;
  float fStack_4908;
  float fStack_4904;
  float local_4720;
  float fStack_471c;
  float fStack_4718;
  float fStack_4714;
  float fStack_4710;
  float fStack_470c;
  float fStack_4708;
  float local_46e0;
  float fStack_46dc;
  float fStack_46d8;
  float fStack_46d4;
  float fStack_46d0;
  float fStack_46cc;
  float fStack_46c8;
  float local_46a0;
  float fStack_469c;
  float fStack_4698;
  float fStack_4694;
  float fStack_4690;
  float fStack_468c;
  float fStack_4688;
  float local_4660;
  float fStack_465c;
  float fStack_4658;
  float fStack_4654;
  float fStack_4650;
  float fStack_464c;
  float fStack_4648;
  float local_4620;
  float fStack_461c;
  float fStack_4618;
  float fStack_4614;
  float fStack_4610;
  float fStack_460c;
  float fStack_4608;
  float local_45e0;
  float fStack_45dc;
  float fStack_45d8;
  float fStack_45d4;
  float fStack_45d0;
  float fStack_45cc;
  float fStack_45c8;
  float local_45a0;
  float fStack_459c;
  float fStack_4598;
  float fStack_4594;
  float fStack_4590;
  float fStack_458c;
  float fStack_4588;
  float local_4560;
  float fStack_455c;
  float fStack_4558;
  float fStack_4554;
  float fStack_4550;
  float fStack_454c;
  float fStack_4548;
  float local_43c0;
  float fStack_43bc;
  float fStack_43b8;
  float fStack_43b4;
  float fStack_43b0;
  float fStack_43ac;
  float fStack_43a8;
  float fStack_43a4;
  float local_43a0;
  float fStack_439c;
  float fStack_4398;
  float fStack_4394;
  float fStack_4390;
  float fStack_438c;
  float fStack_4388;
  float local_4380;
  float fStack_437c;
  float fStack_4378;
  float fStack_4374;
  float fStack_4370;
  float fStack_436c;
  float fStack_4368;
  float fStack_4364;
  ulong uStack_4238;
  float local_4200;
  float fStack_41fc;
  float fStack_41f8;
  float fStack_41f4;
  float fStack_41f0;
  float fStack_41ec;
  float fStack_41e8;
  float fStack_41e4;
  float local_41a0;
  float fStack_419c;
  float fStack_4198;
  float fStack_4194;
  float fStack_4190;
  float fStack_418c;
  float fStack_4188;
  float fStack_4184;
  float local_4160;
  float fStack_415c;
  float fStack_4158;
  float fStack_4154;
  float fStack_4150;
  float fStack_414c;
  float fStack_4148;
  float local_4140;
  float fStack_413c;
  float fStack_4138;
  float fStack_4134;
  float fStack_4130;
  float fStack_412c;
  float fStack_4128;
  undefined4 uStack_4124;
  undefined1 local_40e0 [8];
  float fStack_40d8;
  float fStack_40d4;
  undefined8 uStack_40d0;
  undefined8 uStack_40c8;
  float local_4000;
  float fStack_3ffc;
  float fStack_3ff8;
  float fStack_3ff4;
  float fStack_3ff0;
  float fStack_3fec;
  float fStack_3fe8;
  float fStack_3fe4;
  float local_3fc0;
  float fStack_3fbc;
  float fStack_3fb8;
  float fStack_3fb4;
  float fStack_3fb0;
  float fStack_3fac;
  float fStack_3fa8;
  float fStack_3fa4;
  float local_3f60;
  float fStack_3f5c;
  float fStack_3f58;
  float fStack_3f54;
  float fStack_3f50;
  float fStack_3f4c;
  float fStack_3f48;
  undefined4 uStack_3f44;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  undefined8 uStack_3e10;
  undefined8 uStack_3e08;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined8 uStack_3d10;
  undefined8 uStack_3d08;
  undefined8 local_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  undefined1 local_3bc0 [8];
  float fStack_3bb8;
  float fStack_3bb4;
  float fStack_3bb0;
  float fStack_3bac;
  float fStack_3ba8;
  undefined4 uStack_3ba4;
  undefined1 local_3b80 [16];
  float local_3680;
  float fStack_367c;
  float fStack_3678;
  float fStack_3674;
  float fStack_3670;
  float fStack_366c;
  float fStack_3668;
  float local_34e0;
  float fStack_34dc;
  float fStack_34d8;
  float fStack_34d4;
  float fStack_34d0;
  float fStack_34cc;
  float fStack_34c8;
  float local_3480;
  float fStack_347c;
  float fStack_3478;
  float fStack_3474;
  float fStack_3470;
  float fStack_346c;
  float fStack_3468;
  float fStack_3464;
  undefined8 local_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  undefined1 local_3340 [8];
  float fStack_3338;
  float fStack_3334;
  float fStack_3330;
  float fStack_332c;
  float fStack_3328;
  undefined4 uStack_3324;
  float local_2e00;
  float fStack_2dfc;
  float fStack_2df8;
  float fStack_2df4;
  float fStack_2df0;
  float fStack_2dec;
  float fStack_2de8;
  float local_2c60;
  float fStack_2c5c;
  float fStack_2c58;
  float fStack_2c54;
  float fStack_2c50;
  float fStack_2c4c;
  float fStack_2c48;
  float local_2c00;
  float fStack_2bfc;
  float fStack_2bf8;
  float fStack_2bf4;
  float fStack_2bf0;
  float fStack_2bec;
  float fStack_2be8;
  float fStack_2be4;
  float local_28c0;
  float fStack_28bc;
  float fStack_28b8;
  float fStack_28b4;
  float fStack_28b0;
  float fStack_28ac;
  float fStack_28a8;
  float fStack_28a4;
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  float fStack_26e4;
  float local_2120;
  float fStack_211c;
  float fStack_2118;
  float fStack_2114;
  float fStack_2110;
  float fStack_210c;
  float fStack_2108;
  float local_2100;
  float fStack_20fc;
  float fStack_20f8;
  float fStack_20f4;
  float fStack_20f0;
  float fStack_20ec;
  float fStack_20e8;
  float local_20e0;
  float fStack_20dc;
  float fStack_20d8;
  float fStack_20d4;
  float fStack_20d0;
  float fStack_20cc;
  float fStack_20c8;
  undefined4 uStack_20c4;
  float local_2020;
  float fStack_201c;
  float fStack_2018;
  float fStack_2014;
  float fStack_2010;
  float fStack_200c;
  float fStack_2008;
  float fStack_2004;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined1 local_1e40 [8];
  float fStack_1e38;
  float fStack_1e34;
  float fStack_1e30;
  float fStack_1e2c;
  float fStack_1e28;
  undefined4 uStack_1e24;
  float local_1900;
  float fStack_18fc;
  float fStack_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  float fStack_18e8;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float local_1700;
  float fStack_16fc;
  float fStack_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float fStack_16e8;
  float fStack_16e4;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  undefined1 local_1120 [8];
  float fStack_1118;
  float fStack_1114;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined1 local_10a0 [8];
  float fStack_1098;
  float fStack_1094;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined1 local_1020 [8];
  float fStack_1018;
  float fStack_1014;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined8 local_140;
  undefined8 uStack_138;
  
  lVar72 = in_RSI[7];
  lVar13 = *in_RCX;
  for (local_52ec = 0; local_52ec < (int)lVar72; local_52ec = local_52ec + 1) {
    local_52f8 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_52ec * in_RSI[2]);
    iVar11 = *(int *)((long)in_RDI + 0x2c);
    lVar73 = in_RDI[6];
    lVar74 = in_RDI[7];
    iVar12 = *(int *)((long)in_RSI + 0x2c);
    lVar75 = in_RSI[6];
    for (local_5368 = 0; local_5368 < (int)lVar75; local_5368 = local_5368 + 1) {
      for (local_536c = 0; local_536c < iVar12; local_536c = local_536c + 1) {
        local_53a0 = 0;
        uStack_5398 = 0;
        uStack_5390 = 0;
        uStack_5388 = 0;
        if (lVar13 != 0) {
          puVar78 = (undefined8 *)(lVar13 + (long)(local_52ec << 3) * 4);
          local_53a0 = *puVar78;
          uStack_5398 = puVar78[1];
          uStack_5390 = puVar78[2];
          uStack_5388 = puVar78[3];
        }
        local_53a8 = *in_RDX + in_RDX[8] * (long)local_52ec * in_RDX[2];
        for (local_53f4 = 0; local_53f4 < (int)lVar74; local_53f4 = local_53f4 + 1) {
          for (local_5444 = 0; local_5444 < in_R9D; local_5444 = local_5444 + 1) {
            iVar76 = (local_5368 + local_5444 * dilation_w) - dilation_w * (in_R9D + -1);
            if (((-1 < iVar76) && (iVar76 % stride_w == 0)) && (iVar76 / stride_w < (int)lVar73)) {
              for (local_5450 = 0; local_5450 < in_R8D; local_5450 = local_5450 + 1) {
                iVar77 = (local_536c + local_5450 * in_stack_00000008) -
                         in_stack_00000008 * (in_R8D + -1);
                if (((-1 < iVar77) && (iVar77 % dilation_h == 0)) && (iVar77 / dilation_h < iVar11))
                {
                  pfVar1 = (float *)(*in_RDI + in_RDI[8] * (long)local_53f4 * in_RDI[2] +
                                     (long)*(int *)((long)in_RDI + 0x2c) * (long)(iVar76 / stride_w)
                                     * in_RDI[2] + (long)(iVar77 / dilation_h << 3) * 4);
                  iVar77 = (local_5444 * in_R8D + local_5450) * 0x40;
                  fVar2 = *pfVar1;
                  fVar3 = pfVar1[1];
                  fVar4 = pfVar1[2];
                  fVar5 = pfVar1[3];
                  fVar6 = pfVar1[4];
                  fVar7 = pfVar1[5];
                  fVar8 = pfVar1[6];
                  fVar9 = pfVar1[7];
                  puVar78 = (undefined8 *)(local_53a8 + (long)iVar77 * 4);
                  lVar79 = local_53a8 + (long)iVar77 * 4;
                  lVar80 = local_53a8 + (long)iVar77 * 4;
                  lVar81 = local_53a8 + (long)iVar77 * 4;
                  lVar82 = local_53a8 + (long)iVar77 * 4;
                  lVar83 = local_53a8 + (long)iVar77 * 4;
                  lVar84 = local_53a8 + (long)iVar77 * 4;
                  lVar85 = local_53a8 + (long)iVar77 * 4;
                  local_4720 = (float)*puVar78;
                  fStack_471c = (float)((ulong)*puVar78 >> 0x20);
                  fStack_4718 = (float)puVar78[1];
                  fStack_4714 = (float)((ulong)puVar78[1] >> 0x20);
                  fStack_4710 = (float)puVar78[2];
                  fStack_470c = (float)((ulong)puVar78[2] >> 0x20);
                  fStack_4708 = (float)puVar78[3];
                  local_4920 = (float)local_53a0;
                  fStack_491c = (float)((ulong)local_53a0 >> 0x20);
                  fStack_4918 = (float)uStack_5398;
                  fStack_4914 = (float)((ulong)uStack_5398 >> 0x20);
                  fStack_4910 = (float)uStack_5390;
                  fStack_490c = (float)((ulong)uStack_5390 >> 0x20);
                  fStack_4908 = (float)uStack_5388;
                  fStack_4904 = (float)((ulong)uStack_5388 >> 0x20);
                  local_46e0 = (float)*(undefined8 *)(lVar79 + 0x20);
                  fStack_46dc = (float)((ulong)*(undefined8 *)(lVar79 + 0x20) >> 0x20);
                  fStack_46d8 = (float)*(undefined8 *)(lVar79 + 0x28);
                  fStack_46d4 = (float)((ulong)*(undefined8 *)(lVar79 + 0x28) >> 0x20);
                  fStack_46d0 = (float)*(undefined8 *)(lVar79 + 0x30);
                  fStack_46cc = (float)((ulong)*(undefined8 *)(lVar79 + 0x30) >> 0x20);
                  fStack_46c8 = (float)*(undefined8 *)(lVar79 + 0x38);
                  local_46a0 = (float)*(undefined8 *)(lVar80 + 0x40);
                  fStack_469c = (float)((ulong)*(undefined8 *)(lVar80 + 0x40) >> 0x20);
                  fStack_4698 = (float)*(undefined8 *)(lVar80 + 0x48);
                  fStack_4694 = (float)((ulong)*(undefined8 *)(lVar80 + 0x48) >> 0x20);
                  fStack_4690 = (float)*(undefined8 *)(lVar80 + 0x50);
                  fStack_468c = (float)((ulong)*(undefined8 *)(lVar80 + 0x50) >> 0x20);
                  fStack_4688 = (float)*(undefined8 *)(lVar80 + 0x58);
                  local_4660 = (float)*(undefined8 *)(lVar81 + 0x60);
                  fStack_465c = (float)((ulong)*(undefined8 *)(lVar81 + 0x60) >> 0x20);
                  fStack_4658 = (float)*(undefined8 *)(lVar81 + 0x68);
                  fStack_4654 = (float)((ulong)*(undefined8 *)(lVar81 + 0x68) >> 0x20);
                  fStack_4650 = (float)*(undefined8 *)(lVar81 + 0x70);
                  fStack_464c = (float)((ulong)*(undefined8 *)(lVar81 + 0x70) >> 0x20);
                  fStack_4648 = (float)*(undefined8 *)(lVar81 + 0x78);
                  local_4620 = (float)*(undefined8 *)(lVar82 + 0x80);
                  fStack_461c = (float)((ulong)*(undefined8 *)(lVar82 + 0x80) >> 0x20);
                  fStack_4618 = (float)*(undefined8 *)(lVar82 + 0x88);
                  fStack_4614 = (float)((ulong)*(undefined8 *)(lVar82 + 0x88) >> 0x20);
                  fStack_4610 = (float)*(undefined8 *)(lVar82 + 0x90);
                  fStack_460c = (float)((ulong)*(undefined8 *)(lVar82 + 0x90) >> 0x20);
                  fStack_4608 = (float)*(undefined8 *)(lVar82 + 0x98);
                  local_45e0 = (float)*(undefined8 *)(lVar83 + 0xa0);
                  fStack_45dc = (float)((ulong)*(undefined8 *)(lVar83 + 0xa0) >> 0x20);
                  fStack_45d8 = (float)*(undefined8 *)(lVar83 + 0xa8);
                  fStack_45d4 = (float)((ulong)*(undefined8 *)(lVar83 + 0xa8) >> 0x20);
                  fStack_45d0 = (float)*(undefined8 *)(lVar83 + 0xb0);
                  fStack_45cc = (float)((ulong)*(undefined8 *)(lVar83 + 0xb0) >> 0x20);
                  fStack_45c8 = (float)*(undefined8 *)(lVar83 + 0xb8);
                  local_45a0 = (float)*(undefined8 *)(lVar84 + 0xc0);
                  fStack_459c = (float)((ulong)*(undefined8 *)(lVar84 + 0xc0) >> 0x20);
                  fStack_4598 = (float)*(undefined8 *)(lVar84 + 200);
                  fStack_4594 = (float)((ulong)*(undefined8 *)(lVar84 + 200) >> 0x20);
                  fStack_4590 = (float)*(undefined8 *)(lVar84 + 0xd0);
                  fStack_458c = (float)((ulong)*(undefined8 *)(lVar84 + 0xd0) >> 0x20);
                  fStack_4588 = (float)*(undefined8 *)(lVar84 + 0xd8);
                  local_4560 = (float)*(undefined8 *)(lVar85 + 0xe0);
                  fStack_455c = (float)((ulong)*(undefined8 *)(lVar85 + 0xe0) >> 0x20);
                  fStack_4558 = (float)*(undefined8 *)(lVar85 + 0xe8);
                  fStack_4554 = (float)((ulong)*(undefined8 *)(lVar85 + 0xe8) >> 0x20);
                  fStack_4550 = (float)*(undefined8 *)(lVar85 + 0xf0);
                  fStack_454c = (float)((ulong)*(undefined8 *)(lVar85 + 0xf0) >> 0x20);
                  fStack_4548 = (float)*(undefined8 *)(lVar85 + 0xf8);
                  local_53a0 = CONCAT44(fVar9 * fStack_455c +
                                        fVar8 * fStack_459c +
                                        fVar7 * fStack_45dc +
                                        fVar6 * fStack_461c +
                                        fVar5 * fStack_465c +
                                        fVar4 * fStack_469c +
                                        fVar3 * fStack_46dc + fVar2 * fStack_471c + fStack_491c,
                                        fVar9 * local_4560 +
                                        fVar8 * local_45a0 +
                                        fVar7 * local_45e0 +
                                        fVar6 * local_4620 +
                                        fVar5 * local_4660 +
                                        fVar4 * local_46a0 +
                                        fVar3 * local_46e0 + fVar2 * local_4720 + local_4920);
                  uStack_5398 = CONCAT44(fVar9 * fStack_4554 +
                                         fVar8 * fStack_4594 +
                                         fVar7 * fStack_45d4 +
                                         fVar6 * fStack_4614 +
                                         fVar5 * fStack_4654 +
                                         fVar4 * fStack_4694 +
                                         fVar3 * fStack_46d4 + fVar2 * fStack_4714 + fStack_4914,
                                         fVar9 * fStack_4558 +
                                         fVar8 * fStack_4598 +
                                         fVar7 * fStack_45d8 +
                                         fVar6 * fStack_4618 +
                                         fVar5 * fStack_4658 +
                                         fVar4 * fStack_4698 +
                                         fVar3 * fStack_46d8 + fVar2 * fStack_4718 + fStack_4918);
                  uStack_5390 = CONCAT44(fVar9 * fStack_454c +
                                         fVar8 * fStack_458c +
                                         fVar7 * fStack_45cc +
                                         fVar6 * fStack_460c +
                                         fVar5 * fStack_464c +
                                         fVar4 * fStack_468c +
                                         fVar3 * fStack_46cc + fVar2 * fStack_470c + fStack_490c,
                                         fVar9 * fStack_4550 +
                                         fVar8 * fStack_4590 +
                                         fVar7 * fStack_45d0 +
                                         fVar6 * fStack_4610 +
                                         fVar5 * fStack_4650 +
                                         fVar4 * fStack_4690 +
                                         fVar3 * fStack_46d0 + fVar2 * fStack_4710 + fStack_4910);
                  uStack_5388 = CONCAT44(fVar9 + fVar8 + fVar7 + fVar6 + fVar5 + fVar4 + fVar3 + 
                                                  fVar2 + fStack_4904,
                                         fVar9 * fStack_4548 +
                                         fVar8 * fStack_4588 +
                                         fVar7 * fStack_45c8 +
                                         fVar6 * fStack_4608 +
                                         fVar5 * fStack_4648 +
                                         fVar4 * fStack_4688 +
                                         fVar3 * fStack_46c8 + fVar2 * fStack_4708 + fStack_4908);
                }
              }
            }
          }
          local_53a8 = local_53a8 + (long)(in_R8D * in_R9D * 0x40) * 4;
        }
        plVar24 = (long *)CONCAT44(in_stack_00000034,activation_type);
        local_4140 = (float)local_53a0;
        fStack_413c = (float)((ulong)local_53a0 >> 0x20);
        fStack_4138 = (float)uStack_5398;
        fStack_4134 = (float)((ulong)uStack_5398 >> 0x20);
        fStack_4130 = (float)uStack_5390;
        fStack_412c = (float)((ulong)uStack_5390 >> 0x20);
        fStack_4128 = (float)uStack_5388;
        switch(stride_h) {
        case 1:
          uStack_4978 = SUB328(ZEXT832(0),4);
          auVar25._8_8_ = uStack_5398;
          auVar25._0_8_ = local_53a0;
          auVar25._16_8_ = uStack_5390;
          auVar25._24_8_ = uStack_5388;
          _local_4a00 = vmaxps_avx(auVar25,ZEXT832(uStack_4978) << 0x40);
          break;
        case 2:
          uVar10 = *(uint *)*plVar24;
          auVar28._8_8_ = uStack_5398;
          auVar28._0_8_ = local_53a0;
          auVar28._16_8_ = uStack_5390;
          auVar28._24_8_ = uStack_5388;
          auVar21 = vmaxps_avx(ZEXT832(0),auVar28);
          auVar29._8_8_ = uStack_5398;
          auVar29._0_8_ = local_53a0;
          auVar29._16_8_ = uStack_5390;
          auVar29._24_8_ = uStack_5388;
          auVar20 = vminps_avx(ZEXT832(0),auVar29);
          auVar14 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar10),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar10),0x30);
          auVar15 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(uVar10),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(uVar10),0x30);
          local_4380 = auVar15._0_4_;
          fStack_437c = auVar15._4_4_;
          fStack_4378 = auVar15._8_4_;
          fStack_4374 = auVar15._12_4_;
          fStack_4370 = auVar14._0_4_;
          fStack_436c = auVar14._4_4_;
          fStack_4368 = auVar14._8_4_;
          fStack_4364 = auVar14._12_4_;
          local_43a0 = auVar20._0_4_;
          fStack_439c = auVar20._4_4_;
          fStack_4398 = auVar20._8_4_;
          fStack_4394 = auVar20._12_4_;
          fStack_4390 = auVar20._16_4_;
          fStack_438c = auVar20._20_4_;
          fStack_4388 = auVar20._24_4_;
          local_43c0 = auVar21._0_4_;
          fStack_43bc = auVar21._4_4_;
          fStack_43b8 = auVar21._8_4_;
          fStack_43b4 = auVar21._12_4_;
          fStack_43b0 = auVar21._16_4_;
          fStack_43ac = auVar21._20_4_;
          fStack_43a8 = auVar21._24_4_;
          fStack_43a4 = auVar21._28_4_;
          local_4a00._4_4_ = fStack_43bc + fStack_437c * fStack_439c;
          local_4a00._0_4_ = local_43c0 + local_4380 * local_43a0;
          uStack_49f8._0_4_ = fStack_43b8 + fStack_4378 * fStack_4398;
          uStack_49f8._4_4_ = fStack_43b4 + fStack_4374 * fStack_4394;
          uStack_49f0._0_4_ = fStack_43b0 + fStack_4370 * fStack_4390;
          uStack_49f0._4_4_ = fStack_43ac + fStack_436c * fStack_438c;
          uStack_49e8._0_4_ = fStack_43a8 + fStack_4368 * fStack_4388;
          uStack_49e8._4_4_ = fStack_43a4 + fStack_4364;
          break;
        case 3:
          uVar10 = *(uint *)*plVar24;
          auVar14 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar10),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar10),0x30);
          auVar15 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(uVar10),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(uVar10),0x30);
          uStack_3d50 = auVar15._0_8_;
          uStack_3d48 = auVar15._8_8_;
          uVar10 = *(uint *)(*plVar24 + 4);
          auVar15 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(uVar10),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(uVar10),0x30);
          auVar16 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(uVar10),0x20);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(uVar10),0x30);
          uStack_3d10 = auVar15._0_8_;
          uStack_3d08 = auVar15._8_8_;
          auVar27._8_8_ = uStack_5398;
          auVar27._0_8_ = local_53a0;
          auVar27._16_8_ = uStack_5390;
          auVar27._24_8_ = uStack_5388;
          auVar26._16_8_ = uStack_3d50;
          auVar26._0_16_ = auVar14;
          auVar26._24_8_ = uStack_3d48;
          auVar21 = vmaxps_avx(auVar27,auVar26);
          auVar30._16_8_ = uStack_3d10;
          auVar30._0_16_ = auVar16;
          auVar30._24_8_ = uStack_3d08;
          _local_4a00 = vminps_avx(auVar21,auVar30);
          break;
        case 4:
          auVar14 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x3f800000),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x3f800000),0x30);
          auVar15 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3f800000),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3f800000),0x30);
          uStack_3e10 = auVar15._0_8_;
          uStack_3e08 = auVar15._8_8_;
          uStack_4238 = SUB328(ZEXT832(0),4);
          auVar36._8_8_ = uStack_5398;
          auVar36._0_8_ = local_53a0;
          auVar36._16_8_ = uStack_5390;
          auVar36._24_8_ = uStack_5388;
          auVar21 = vsubps_avx(ZEXT832(uStack_4238) << 0x40,auVar36);
          auVar35._8_8_ = 0x42b0c0a542b0c0a5;
          auVar35._0_8_ = 0x42b0c0a542b0c0a5;
          auVar35._16_8_ = 0x42b0c0a542b0c0a5;
          auVar35._24_8_ = 0x42b0c0a542b0c0a5;
          auVar21 = vminps_avx(auVar21,auVar35);
          auVar34._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar34._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar34._16_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar34._24_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar20 = vmaxps_avx(auVar21,auVar34);
          local_2e00 = auVar20._0_4_;
          fStack_2dfc = auVar20._4_4_;
          fStack_2df8 = auVar20._8_4_;
          fStack_2df4 = auVar20._12_4_;
          fStack_2df0 = auVar20._16_4_;
          fStack_2dec = auVar20._20_4_;
          fStack_2de8 = auVar20._24_4_;
          local_3340._4_4_ = fStack_2dfc * 1.442695 + 0.5;
          local_3340._0_4_ = local_2e00 * 1.442695 + 0.5;
          fStack_3338 = fStack_2df8 * 1.442695 + 0.5;
          fStack_3334 = fStack_2df4 * 1.442695 + 0.5;
          fStack_3330 = fStack_2df0 * 1.442695 + 0.5;
          fStack_332c = fStack_2dec * 1.442695 + 0.5;
          fStack_3328 = fStack_2de8 * 1.442695 + 0.5;
          uStack_3324 = 0x3ff8aa3b;
          auVar23 = vroundps_avx(_local_3340,1);
          auVar21 = vcmpps_avx(_local_3340,auVar23,1);
          auVar37._8_8_ = 0x3f8000003f800000;
          auVar37._0_8_ = 0x3f8000003f800000;
          auVar37._16_8_ = 0x3f8000003f800000;
          auVar37._24_8_ = 0x3f8000003f800000;
          auVar21 = vandps_avx(auVar21,auVar37);
          auVar21 = vsubps_avx(auVar23,auVar21);
          local_28c0 = auVar21._0_4_;
          fStack_28bc = auVar21._4_4_;
          fStack_28b8 = auVar21._8_4_;
          fStack_28b4 = auVar21._12_4_;
          fStack_28b0 = auVar21._16_4_;
          fStack_28ac = auVar21._20_4_;
          fStack_28a8 = auVar21._24_4_;
          fStack_28a4 = auVar21._28_4_;
          auVar40._4_4_ = fStack_28bc * 0.6933594;
          auVar40._0_4_ = local_28c0 * 0.6933594;
          auVar40._8_4_ = fStack_28b8 * 0.6933594;
          auVar40._12_4_ = fStack_28b4 * 0.6933594;
          auVar40._16_4_ = fStack_28b0 * 0.6933594;
          auVar40._20_4_ = fStack_28ac * 0.6933594;
          auVar40._24_4_ = fStack_28a8 * 0.6933594;
          auVar40._28_4_ = fStack_28a4;
          auVar21 = vsubps_avx(auVar20,auVar40);
          auVar39._4_4_ = fStack_28bc * -0.00021219444;
          auVar39._0_4_ = local_28c0 * -0.00021219444;
          auVar39._8_4_ = fStack_28b8 * -0.00021219444;
          auVar39._12_4_ = fStack_28b4 * -0.00021219444;
          auVar39._16_4_ = fStack_28b0 * -0.00021219444;
          auVar39._20_4_ = fStack_28ac * -0.00021219444;
          auVar39._24_4_ = fStack_28a8 * -0.00021219444;
          auVar39._28_4_ = fStack_28a4;
          auVar21 = vsubps_avx(auVar21,auVar39);
          local_2c00 = auVar21._0_4_;
          fStack_2bfc = auVar21._4_4_;
          fStack_2bf8 = auVar21._8_4_;
          fStack_2bf4 = auVar21._12_4_;
          fStack_2bf0 = auVar21._16_4_;
          fStack_2bec = auVar21._20_4_;
          fStack_2be8 = auVar21._24_4_;
          fStack_2be4 = auVar21._28_4_;
          local_3360 = CONCAT44((int)fStack_28bc,(int)local_28c0);
          uStack_3358 = CONCAT44((int)fStack_28b4,(int)fStack_28b8);
          uStack_3350 = CONCAT44((int)fStack_28ac,(int)fStack_28b0);
          uStack_3348 = CONCAT44((int)fStack_28a4,(int)fStack_28a8);
          auVar46._8_8_ = uStack_3358;
          auVar46._0_8_ = local_3360;
          auVar45._8_8_ = 0x7f0000007f;
          auVar45._0_8_ = 0x7f0000007f;
          auVar16 = vpaddd_avx(auVar46,auVar45);
          auVar44._8_8_ = uStack_3348;
          auVar44._0_8_ = uStack_3350;
          auVar43._8_8_ = 0x7f0000007f;
          auVar43._0_8_ = 0x7f0000007f;
          auVar17 = vpaddd_avx(auVar44,auVar43);
          auVar16 = vpslld_avx(auVar16,ZEXT416(0x17));
          auVar17 = vpslld_avx(auVar17,ZEXT416(0x17));
          local_2c60 = auVar16._0_4_;
          fStack_2c5c = auVar16._4_4_;
          fStack_2c58 = auVar16._8_4_;
          fStack_2c54 = auVar16._12_4_;
          fStack_2c50 = auVar17._0_4_;
          fStack_2c4c = auVar17._4_4_;
          fStack_2c48 = auVar17._8_4_;
          local_4200 = auVar14._0_4_;
          fStack_41fc = auVar14._4_4_;
          fStack_41f8 = auVar14._8_4_;
          fStack_41f4 = auVar14._12_4_;
          fStack_41f0 = auVar15._0_4_;
          fStack_41ec = auVar15._4_4_;
          fStack_41e8 = auVar15._8_4_;
          fStack_41e4 = auVar15._12_4_;
          auVar32._16_8_ = uStack_3e10;
          auVar32._0_16_ = auVar14;
          auVar32._24_8_ = uStack_3e08;
          auVar31._4_4_ =
               fStack_41fc +
               ((((((fStack_2bfc * 0.00019875691 + 0.0013981999) * fStack_2bfc + 0.008333452) *
                   fStack_2bfc + 0.041665796) * fStack_2bfc + 0.16666666) * fStack_2bfc + 0.5) *
                fStack_2bfc * fStack_2bfc + fStack_2bfc + 1.0) * fStack_2c5c;
          auVar31._0_4_ =
               local_4200 +
               ((((((local_2c00 * 0.00019875691 + 0.0013981999) * local_2c00 + 0.008333452) *
                   local_2c00 + 0.041665796) * local_2c00 + 0.16666666) * local_2c00 + 0.5) *
                local_2c00 * local_2c00 + local_2c00 + 1.0) * local_2c60;
          auVar31._8_4_ =
               fStack_41f8 +
               ((((((fStack_2bf8 * 0.00019875691 + 0.0013981999) * fStack_2bf8 + 0.008333452) *
                   fStack_2bf8 + 0.041665796) * fStack_2bf8 + 0.16666666) * fStack_2bf8 + 0.5) *
                fStack_2bf8 * fStack_2bf8 + fStack_2bf8 + 1.0) * fStack_2c58;
          auVar31._12_4_ =
               fStack_41f4 +
               ((((((fStack_2bf4 * 0.00019875691 + 0.0013981999) * fStack_2bf4 + 0.008333452) *
                   fStack_2bf4 + 0.041665796) * fStack_2bf4 + 0.16666666) * fStack_2bf4 + 0.5) *
                fStack_2bf4 * fStack_2bf4 + fStack_2bf4 + 1.0) * fStack_2c54;
          auVar31._16_4_ =
               fStack_41f0 +
               ((((((fStack_2bf0 * 0.00019875691 + 0.0013981999) * fStack_2bf0 + 0.008333452) *
                   fStack_2bf0 + 0.041665796) * fStack_2bf0 + 0.16666666) * fStack_2bf0 + 0.5) *
                fStack_2bf0 * fStack_2bf0 + fStack_2bf0 + 1.0) * fStack_2c50;
          auVar31._20_4_ =
               fStack_41ec +
               ((((((fStack_2bec * 0.00019875691 + 0.0013981999) * fStack_2bec + 0.008333452) *
                   fStack_2bec + 0.041665796) * fStack_2bec + 0.16666666) * fStack_2bec + 0.5) *
                fStack_2bec * fStack_2bec + fStack_2bec + 1.0) * fStack_2c4c;
          auVar31._24_4_ =
               fStack_41e8 +
               ((((((fStack_2be8 * 0.00019875691 + 0.0013981999) * fStack_2be8 + 0.008333452) *
                   fStack_2be8 + 0.041665796) * fStack_2be8 + 0.16666666) * fStack_2be8 + 0.5) *
                fStack_2be8 * fStack_2be8 + fStack_2be8 + 1.0) * fStack_2c48;
          auVar31._28_4_ = fStack_41e4 + fStack_2be4 + fStack_2be4 + 1.0;
          _local_4a00 = vdivps_avx(auVar32,auVar31);
          break;
        case 5:
          local_3b80._8_8_ = uStack_5398;
          local_3b80._0_8_ = local_53a0;
          auVar33._16_8_ = uStack_5390;
          auVar33._0_16_ = local_3b80;
          auVar33._24_8_ = uStack_5388;
          auVar22._8_8_ = 0x42b0c0a542b0c0a5;
          auVar22._0_8_ = 0x42b0c0a542b0c0a5;
          auVar22._16_8_ = 0x42b0c0a542b0c0a5;
          auVar22._24_8_ = 0x42b0c0a542b0c0a5;
          auVar21 = vminps_avx(auVar33,auVar22);
          auVar23._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar23._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar23._16_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar23._24_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar20 = vmaxps_avx(auVar21,auVar23);
          local_3680 = auVar20._0_4_;
          fStack_367c = auVar20._4_4_;
          fStack_3678 = auVar20._8_4_;
          fStack_3674 = auVar20._12_4_;
          fStack_3670 = auVar20._16_4_;
          fStack_366c = auVar20._20_4_;
          fStack_3668 = auVar20._24_4_;
          local_3bc0._4_4_ = fStack_367c * 1.442695 + 0.5;
          local_3bc0._0_4_ = local_3680 * 1.442695 + 0.5;
          fStack_3bb8 = fStack_3678 * 1.442695 + 0.5;
          fStack_3bb4 = fStack_3674 * 1.442695 + 0.5;
          fStack_3bb0 = fStack_3670 * 1.442695 + 0.5;
          fStack_3bac = fStack_366c * 1.442695 + 0.5;
          fStack_3ba8 = fStack_3668 * 1.442695 + 0.5;
          uStack_3ba4 = 0x3ff8aa3b;
          auVar23 = vroundps_avx(_local_3bc0,1);
          auVar21 = vcmpps_avx(_local_3bc0,auVar23,1);
          auVar38._8_8_ = 0x3f8000003f800000;
          auVar38._0_8_ = 0x3f8000003f800000;
          auVar38._16_8_ = 0x3f8000003f800000;
          auVar38._24_8_ = 0x3f8000003f800000;
          auVar21 = vandps_avx(auVar21,auVar38);
          auVar21 = vsubps_avx(auVar23,auVar21);
          local_2700 = auVar21._0_4_;
          fStack_26fc = auVar21._4_4_;
          fStack_26f8 = auVar21._8_4_;
          fStack_26f4 = auVar21._12_4_;
          fStack_26f0 = auVar21._16_4_;
          fStack_26ec = auVar21._20_4_;
          fStack_26e8 = auVar21._24_4_;
          fStack_26e4 = auVar21._28_4_;
          auVar42._4_4_ = fStack_26fc * 0.6933594;
          auVar42._0_4_ = local_2700 * 0.6933594;
          auVar42._8_4_ = fStack_26f8 * 0.6933594;
          auVar42._12_4_ = fStack_26f4 * 0.6933594;
          auVar42._16_4_ = fStack_26f0 * 0.6933594;
          auVar42._20_4_ = fStack_26ec * 0.6933594;
          auVar42._24_4_ = fStack_26e8 * 0.6933594;
          auVar42._28_4_ = fStack_26e4;
          auVar21 = vsubps_avx(auVar20,auVar42);
          auVar41._4_4_ = fStack_26fc * -0.00021219444;
          auVar41._0_4_ = local_2700 * -0.00021219444;
          auVar41._8_4_ = fStack_26f8 * -0.00021219444;
          auVar41._12_4_ = fStack_26f4 * -0.00021219444;
          auVar41._16_4_ = fStack_26f0 * -0.00021219444;
          auVar41._20_4_ = fStack_26ec * -0.00021219444;
          auVar41._24_4_ = fStack_26e8 * -0.00021219444;
          auVar41._28_4_ = fStack_26e4;
          auVar21 = vsubps_avx(auVar21,auVar41);
          local_3480 = auVar21._0_4_;
          fStack_347c = auVar21._4_4_;
          fStack_3478 = auVar21._8_4_;
          fStack_3474 = auVar21._12_4_;
          fStack_3470 = auVar21._16_4_;
          fStack_346c = auVar21._20_4_;
          fStack_3468 = auVar21._24_4_;
          fStack_3464 = auVar21._28_4_;
          local_3be0 = CONCAT44((int)fStack_26fc,(int)local_2700);
          uStack_3bd8 = CONCAT44((int)fStack_26f4,(int)fStack_26f8);
          uStack_3bd0 = CONCAT44((int)fStack_26ec,(int)fStack_26f0);
          uStack_3bc8 = CONCAT44((int)fStack_26e4,(int)fStack_26e8);
          auVar17._8_8_ = uStack_3bd8;
          auVar17._0_8_ = local_3be0;
          auVar14._8_8_ = 0x7f0000007f;
          auVar14._0_8_ = 0x7f0000007f;
          auVar14 = vpaddd_avx(auVar17,auVar14);
          auVar16._8_8_ = uStack_3bc8;
          auVar16._0_8_ = uStack_3bd0;
          auVar15._8_8_ = 0x7f0000007f;
          auVar15._0_8_ = 0x7f0000007f;
          auVar15 = vpaddd_avx(auVar16,auVar15);
          auVar14 = vpslld_avx(auVar14,ZEXT416(0x17));
          auVar15 = vpslld_avx(auVar15,ZEXT416(0x17));
          local_34e0 = auVar14._0_4_;
          fStack_34dc = auVar14._4_4_;
          fStack_34d8 = auVar14._8_4_;
          fStack_34d4 = auVar14._12_4_;
          fStack_34d0 = auVar15._0_4_;
          fStack_34cc = auVar15._4_4_;
          fStack_34c8 = auVar15._8_4_;
          auVar14 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x3f800000),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x3f800000),0x30);
          auVar15 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3f800000),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3f800000),0x30);
          uStack_5a58 = SUB328(ZEXT832(0),4);
          local_41a0 = auVar14._0_4_;
          fStack_419c = auVar14._4_4_;
          fStack_4198 = auVar14._8_4_;
          fStack_4194 = auVar14._12_4_;
          fStack_4190 = auVar15._0_4_;
          fStack_418c = auVar15._4_4_;
          fStack_4188 = auVar15._8_4_;
          fStack_4184 = auVar15._12_4_;
          local_1020._4_4_ =
               ((((((fStack_347c * 0.00019875691 + 0.0013981999) * fStack_347c + 0.008333452) *
                   fStack_347c + 0.041665796) * fStack_347c + 0.16666666) * fStack_347c + 0.5) *
                fStack_347c * fStack_347c + fStack_347c + 1.0) * fStack_34dc + fStack_419c;
          local_1020._0_4_ =
               ((((((local_3480 * 0.00019875691 + 0.0013981999) * local_3480 + 0.008333452) *
                   local_3480 + 0.041665796) * local_3480 + 0.16666666) * local_3480 + 0.5) *
                local_3480 * local_3480 + local_3480 + 1.0) * local_34e0 + local_41a0;
          fStack_1018 = ((((((fStack_3478 * 0.00019875691 + 0.0013981999) * fStack_3478 +
                            0.008333452) * fStack_3478 + 0.041665796) * fStack_3478 + 0.16666666) *
                          fStack_3478 + 0.5) * fStack_3478 * fStack_3478 + fStack_3478 + 1.0) *
                        fStack_34d8 + fStack_4198;
          fStack_1014 = ((((((fStack_3474 * 0.00019875691 + 0.0013981999) * fStack_3474 +
                            0.008333452) * fStack_3474 + 0.041665796) * fStack_3474 + 0.16666666) *
                          fStack_3474 + 0.5) * fStack_3474 * fStack_3474 + fStack_3474 + 1.0) *
                        fStack_34d4 + fStack_4194;
          uStack_1010._0_4_ =
               ((((((fStack_3470 * 0.00019875691 + 0.0013981999) * fStack_3470 + 0.008333452) *
                   fStack_3470 + 0.041665796) * fStack_3470 + 0.16666666) * fStack_3470 + 0.5) *
                fStack_3470 * fStack_3470 + fStack_3470 + 1.0) * fStack_34d0 + fStack_4190;
          uStack_1010._4_4_ =
               ((((((fStack_346c * 0.00019875691 + 0.0013981999) * fStack_346c + 0.008333452) *
                   fStack_346c + 0.041665796) * fStack_346c + 0.16666666) * fStack_346c + 0.5) *
                fStack_346c * fStack_346c + fStack_346c + 1.0) * fStack_34cc + fStack_418c;
          uStack_1008._0_4_ =
               ((((((fStack_3468 * 0.00019875691 + 0.0013981999) * fStack_3468 + 0.008333452) *
                   fStack_3468 + 0.041665796) * fStack_3468 + 0.16666666) * fStack_3468 + 0.5) *
                fStack_3468 * fStack_3468 + fStack_3468 + 1.0) * fStack_34c8 + fStack_4188;
          uStack_1008._4_4_ = fStack_3464 + fStack_3464 + 1.0 + fStack_4184;
          auVar21 = _local_1020;
          auVar23 = vcmpps_avx(_local_1020,ZEXT832(uStack_5a58) << 0x40,2);
          uStack_1008 = auVar21._24_8_;
          auVar60._16_8_ = uStack_1010;
          auVar60._0_16_ = _local_1020;
          auVar60._24_8_ = uStack_1008;
          auVar59._8_8_ = 0x80000000800000;
          auVar59._0_8_ = 0x80000000800000;
          auVar59._16_8_ = 0x80000000800000;
          auVar59._24_8_ = 0x80000000800000;
          auVar21 = vmaxps_avx(auVar60,auVar59);
          auVar14 = vpsrld_avx(auVar21._0_16_,ZEXT416(0x17));
          auVar15 = vpsrld_avx(auVar21._16_16_,ZEXT416(0x17));
          auVar64._8_8_ = 0x807fffff807fffff;
          auVar64._0_8_ = 0x807fffff807fffff;
          auVar64._16_8_ = 0x807fffff807fffff;
          auVar64._24_8_ = 0x807fffff807fffff;
          auVar21 = vandps_avx(auVar21,auVar64);
          auVar68._8_8_ = 0x3f0000003f000000;
          auVar68._0_8_ = 0x3f0000003f000000;
          auVar68._16_8_ = 0x3f0000003f000000;
          auVar68._24_8_ = 0x3f0000003f000000;
          auVar22 = vorps_avx(auVar21,auVar68);
          auVar71._8_8_ = 0x7f0000007f;
          auVar71._0_8_ = 0x7f0000007f;
          auVar14 = vpsubd_avx(auVar14,auVar71);
          auVar70._8_8_ = 0x7f0000007f;
          auVar70._0_8_ = 0x7f0000007f;
          auVar15 = vpsubd_avx(auVar15,auVar70);
          local_140 = auVar15._0_8_;
          uStack_138 = auVar15._8_8_;
          auVar69._16_8_ = local_140;
          auVar69._0_16_ = auVar14;
          auVar69._24_8_ = uStack_138;
          auVar21 = vcvtdq2ps_avx(auVar69);
          local_900 = auVar21._0_4_;
          fStack_8fc = auVar21._4_4_;
          fStack_8f8 = auVar21._8_4_;
          fStack_8f4 = auVar21._12_4_;
          fStack_8f0 = auVar21._16_4_;
          fStack_8ec = auVar21._20_4_;
          fStack_8e8 = auVar21._24_4_;
          fStack_8e4 = auVar21._28_4_;
          local_10a0._4_4_ = fStack_8fc + 1.0;
          local_10a0._0_4_ = local_900 + 1.0;
          fStack_1098 = fStack_8f8 + 1.0;
          fStack_1094 = fStack_8f4 + 1.0;
          uStack_1090._0_4_ = fStack_8f0 + 1.0;
          uStack_1090._4_4_ = fStack_8ec + 1.0;
          uStack_1088._0_4_ = fStack_8e8 + 1.0;
          uStack_1088._4_4_ = fStack_8e4 + 1.0;
          auVar33 = _local_10a0;
          auVar20 = vcmpps_avx(auVar22,_DAT_01f03d20,1);
          auVar21 = vandps_avx(auVar22,auVar20);
          auVar62._8_8_ = 0x3f8000003f800000;
          auVar62._0_8_ = 0x3f8000003f800000;
          auVar62._16_8_ = 0x3f8000003f800000;
          auVar62._24_8_ = 0x3f8000003f800000;
          auVar22 = vsubps_avx(auVar22,auVar62);
          uStack_1088 = auVar33._24_8_;
          auVar63._8_8_ = 0x3f8000003f800000;
          auVar63._0_8_ = 0x3f8000003f800000;
          auVar63._16_8_ = 0x3f8000003f800000;
          auVar63._24_8_ = 0x3f8000003f800000;
          auVar20 = vandps_avx(auVar63,auVar20);
          auVar61._16_8_ = uStack_1090;
          auVar61._0_16_ = _local_10a0;
          auVar61._24_8_ = uStack_1088;
          auVar20 = vsubps_avx(auVar61,auVar20);
          local_940 = auVar22._0_4_;
          fStack_93c = auVar22._4_4_;
          fStack_938 = auVar22._8_4_;
          fStack_934 = auVar22._12_4_;
          fStack_930 = auVar22._16_4_;
          fStack_92c = auVar22._20_4_;
          fStack_928 = auVar22._24_4_;
          fStack_924 = auVar22._28_4_;
          local_960 = auVar21._0_4_;
          fStack_95c = auVar21._4_4_;
          fStack_958 = auVar21._8_4_;
          fStack_954 = auVar21._12_4_;
          fStack_950 = auVar21._16_4_;
          fStack_94c = auVar21._20_4_;
          fStack_948 = auVar21._24_4_;
          fStack_944 = auVar21._28_4_;
          local_940 = local_940 + local_960;
          fStack_93c = fStack_93c + fStack_95c;
          fStack_938 = fStack_938 + fStack_958;
          fStack_934 = fStack_934 + fStack_954;
          fStack_930 = fStack_930 + fStack_950;
          fStack_92c = fStack_92c + fStack_94c;
          fStack_928 = fStack_928 + fStack_948;
          fStack_924 = fStack_924 + fStack_944;
          local_6c0 = auVar20._0_4_;
          fStack_6bc = auVar20._4_4_;
          fStack_6b8 = auVar20._8_4_;
          fStack_6b4 = auVar20._12_4_;
          fStack_6b0 = auVar20._16_4_;
          fStack_6ac = auVar20._20_4_;
          fStack_6a8 = auVar20._24_4_;
          local_1120._4_4_ =
               fStack_6bc * -0.00021219444 +
               ((((((((fStack_93c * 0.070376836 + -0.1151461) * fStack_93c + 0.116769984) *
                     fStack_93c + -0.12420141) * fStack_93c + 0.14249323) * fStack_93c + -0.16668057
                  ) * fStack_93c + 0.20000714) * fStack_93c + -0.24999994) * fStack_93c + 0.3333333)
               * fStack_93c * fStack_93c * fStack_93c;
          local_1120._0_4_ =
               local_6c0 * -0.00021219444 +
               ((((((((local_940 * 0.070376836 + -0.1151461) * local_940 + 0.116769984) * local_940
                    + -0.12420141) * local_940 + 0.14249323) * local_940 + -0.16668057) * local_940
                 + 0.20000714) * local_940 + -0.24999994) * local_940 + 0.3333333) * local_940 *
               local_940 * local_940;
          fStack_1118 = fStack_6b8 * -0.00021219444 +
                        ((((((((fStack_938 * 0.070376836 + -0.1151461) * fStack_938 + 0.116769984) *
                              fStack_938 + -0.12420141) * fStack_938 + 0.14249323) * fStack_938 +
                           -0.16668057) * fStack_938 + 0.20000714) * fStack_938 + -0.24999994) *
                         fStack_938 + 0.3333333) * fStack_938 * fStack_938 * fStack_938;
          fStack_1114 = fStack_6b4 * -0.00021219444 +
                        ((((((((fStack_934 * 0.070376836 + -0.1151461) * fStack_934 + 0.116769984) *
                              fStack_934 + -0.12420141) * fStack_934 + 0.14249323) * fStack_934 +
                           -0.16668057) * fStack_934 + 0.20000714) * fStack_934 + -0.24999994) *
                         fStack_934 + 0.3333333) * fStack_934 * fStack_934 * fStack_934;
          uStack_1110._0_4_ =
               fStack_6b0 * -0.00021219444 +
               ((((((((fStack_930 * 0.070376836 + -0.1151461) * fStack_930 + 0.116769984) *
                     fStack_930 + -0.12420141) * fStack_930 + 0.14249323) * fStack_930 + -0.16668057
                  ) * fStack_930 + 0.20000714) * fStack_930 + -0.24999994) * fStack_930 + 0.3333333)
               * fStack_930 * fStack_930 * fStack_930;
          uStack_1110._4_4_ =
               fStack_6ac * -0.00021219444 +
               ((((((((fStack_92c * 0.070376836 + -0.1151461) * fStack_92c + 0.116769984) *
                     fStack_92c + -0.12420141) * fStack_92c + 0.14249323) * fStack_92c + -0.16668057
                  ) * fStack_92c + 0.20000714) * fStack_92c + -0.24999994) * fStack_92c + 0.3333333)
               * fStack_92c * fStack_92c * fStack_92c;
          uStack_1108._0_4_ =
               fStack_6a8 * -0.00021219444 +
               ((((((((fStack_928 * 0.070376836 + -0.1151461) * fStack_928 + 0.116769984) *
                     fStack_928 + -0.12420141) * fStack_928 + 0.14249323) * fStack_928 + -0.16668057
                  ) * fStack_928 + 0.20000714) * fStack_928 + -0.24999994) * fStack_928 + 0.3333333)
               * fStack_928 * fStack_928 * fStack_928;
          uStack_1108._4_4_ = fStack_924 + 0.3333333 + -0.00021219444;
          auVar21 = _local_1120;
          uStack_1108 = auVar21._24_8_;
          auVar66._16_8_ = uStack_1110;
          auVar66._0_16_ = _local_1120;
          auVar66._24_8_ = uStack_1108;
          auVar65._4_4_ = fStack_93c * fStack_93c * 0.5;
          auVar65._0_4_ = local_940 * local_940 * 0.5;
          auVar65._8_4_ = fStack_938 * fStack_938 * 0.5;
          auVar65._12_4_ = fStack_934 * fStack_934 * 0.5;
          auVar65._16_4_ = fStack_930 * fStack_930 * 0.5;
          auVar65._20_4_ = fStack_92c * fStack_92c * 0.5;
          auVar65._24_4_ = fStack_928 * fStack_928 * 0.5;
          auVar65._28_4_ = fStack_924;
          auVar21 = vsubps_avx(auVar66,auVar65);
          local_9a0 = auVar21._0_4_;
          fStack_99c = auVar21._4_4_;
          fStack_998 = auVar21._8_4_;
          fStack_994 = auVar21._12_4_;
          fStack_990 = auVar21._16_4_;
          fStack_98c = auVar21._20_4_;
          fStack_988 = auVar21._24_4_;
          fStack_984 = auVar21._28_4_;
          local_1020._4_4_ = fStack_6bc * 0.6933594 + fStack_93c + fStack_99c;
          local_1020._0_4_ = local_6c0 * 0.6933594 + local_940 + local_9a0;
          fStack_1018 = fStack_6b8 * 0.6933594 + fStack_938 + fStack_998;
          fStack_1014 = fStack_6b4 * 0.6933594 + fStack_934 + fStack_994;
          uStack_1010._0_4_ = fStack_6b0 * 0.6933594 + fStack_930 + fStack_990;
          uStack_1010._4_4_ = fStack_6ac * 0.6933594 + fStack_92c + fStack_98c;
          uStack_1008._0_4_ = fStack_6a8 * 0.6933594 + fStack_928 + fStack_988;
          uStack_1008._4_4_ = fStack_924 + fStack_984 + 0.6933594;
          auVar21 = _local_1020;
          uStack_1008 = auVar21._24_8_;
          auVar67._16_8_ = uStack_1010;
          auVar67._0_16_ = _local_1020;
          auVar67._24_8_ = uStack_1008;
          auVar21 = vorps_avx(auVar67,auVar23);
          auVar14 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x3f800000),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x3f800000),0x30);
          auVar15 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3f800000),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3f800000),0x30);
          uStack_1f90 = auVar15._0_8_;
          uStack_1f88 = auVar15._8_8_;
          auVar15 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x40000000),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x40000000),0x30);
          auVar16 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40000000),0x20);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40000000),0x30);
          local_20e0 = auVar21._0_4_;
          fStack_20dc = auVar21._4_4_;
          fStack_20d8 = auVar21._8_4_;
          fStack_20d4 = auVar21._12_4_;
          fStack_20d0 = auVar21._16_4_;
          fStack_20cc = auVar21._20_4_;
          fStack_20c8 = auVar21._24_4_;
          uStack_20c4 = auVar21._28_4_;
          local_2100 = auVar15._0_4_;
          fStack_20fc = auVar15._4_4_;
          fStack_20f8 = auVar15._8_4_;
          fStack_20f4 = auVar15._12_4_;
          fStack_20f0 = auVar16._0_4_;
          fStack_20ec = auVar16._4_4_;
          fStack_20e8 = auVar16._8_4_;
          auVar15 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3f800000),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3f800000),0x30);
          auVar16 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x20);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x30);
          uStack_1fd0 = auVar16._0_8_;
          uStack_1fc8 = auVar16._8_8_;
          auVar51._4_4_ = fStack_20dc * fStack_20fc;
          auVar51._0_4_ = local_20e0 * local_2100;
          auVar51._12_4_ = fStack_20d4 * fStack_20f4;
          auVar51._8_4_ = fStack_20d8 * fStack_20f8;
          auVar51._20_4_ = fStack_20cc * fStack_20ec;
          auVar51._16_4_ = fStack_20d0 * fStack_20f0;
          auVar51._28_4_ = uStack_20c4;
          auVar51._24_4_ = fStack_20c8 * fStack_20e8;
          auVar21 = vsubps_avx(ZEXT832(uStack_5a58) << 0x40,auVar51);
          auVar50._8_8_ = 0x42b0c0a542b0c0a5;
          auVar50._0_8_ = 0x42b0c0a542b0c0a5;
          auVar50._16_8_ = 0x42b0c0a542b0c0a5;
          auVar50._24_8_ = 0x42b0c0a542b0c0a5;
          auVar21 = vminps_avx(auVar21,auVar50);
          auVar49._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar49._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar49._16_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar49._24_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar20 = vmaxps_avx(auVar21,auVar49);
          local_1900 = auVar20._0_4_;
          fStack_18fc = auVar20._4_4_;
          fStack_18f8 = auVar20._8_4_;
          fStack_18f4 = auVar20._12_4_;
          fStack_18f0 = auVar20._16_4_;
          fStack_18ec = auVar20._20_4_;
          fStack_18e8 = auVar20._24_4_;
          local_1e40._4_4_ = fStack_18fc * 1.442695 + 0.5;
          local_1e40._0_4_ = local_1900 * 1.442695 + 0.5;
          fStack_1e38 = fStack_18f8 * 1.442695 + 0.5;
          fStack_1e34 = fStack_18f4 * 1.442695 + 0.5;
          fStack_1e30 = fStack_18f0 * 1.442695 + 0.5;
          fStack_1e2c = fStack_18ec * 1.442695 + 0.5;
          fStack_1e28 = fStack_18e8 * 1.442695 + 0.5;
          uStack_1e24 = 0x3ff8aa3b;
          auVar23 = vroundps_avx(_local_1e40,1);
          auVar21 = vcmpps_avx(_local_1e40,auVar23,1);
          auVar54._8_8_ = 0x3f8000003f800000;
          auVar54._0_8_ = 0x3f8000003f800000;
          auVar54._16_8_ = 0x3f8000003f800000;
          auVar54._24_8_ = 0x3f8000003f800000;
          auVar21 = vandps_avx(auVar21,auVar54);
          auVar21 = vsubps_avx(auVar23,auVar21);
          local_1400 = auVar21._0_4_;
          fStack_13fc = auVar21._4_4_;
          fStack_13f8 = auVar21._8_4_;
          fStack_13f4 = auVar21._12_4_;
          fStack_13f0 = auVar21._16_4_;
          fStack_13ec = auVar21._20_4_;
          fStack_13e8 = auVar21._24_4_;
          fStack_13e4 = auVar21._28_4_;
          auVar56._4_4_ = fStack_13fc * 0.6933594;
          auVar56._0_4_ = local_1400 * 0.6933594;
          auVar56._8_4_ = fStack_13f8 * 0.6933594;
          auVar56._12_4_ = fStack_13f4 * 0.6933594;
          auVar56._16_4_ = fStack_13f0 * 0.6933594;
          auVar56._20_4_ = fStack_13ec * 0.6933594;
          auVar56._24_4_ = fStack_13e8 * 0.6933594;
          auVar56._28_4_ = fStack_13e4;
          auVar21 = vsubps_avx(auVar20,auVar56);
          auVar55._4_4_ = fStack_13fc * -0.00021219444;
          auVar55._0_4_ = local_1400 * -0.00021219444;
          auVar55._8_4_ = fStack_13f8 * -0.00021219444;
          auVar55._12_4_ = fStack_13f4 * -0.00021219444;
          auVar55._16_4_ = fStack_13f0 * -0.00021219444;
          auVar55._20_4_ = fStack_13ec * -0.00021219444;
          auVar55._24_4_ = fStack_13e8 * -0.00021219444;
          auVar55._28_4_ = fStack_13e4;
          auVar21 = vsubps_avx(auVar21,auVar55);
          local_1700 = auVar21._0_4_;
          fStack_16fc = auVar21._4_4_;
          fStack_16f8 = auVar21._8_4_;
          fStack_16f4 = auVar21._12_4_;
          fStack_16f0 = auVar21._16_4_;
          fStack_16ec = auVar21._20_4_;
          fStack_16e8 = auVar21._24_4_;
          fStack_16e4 = auVar21._28_4_;
          local_1e60 = CONCAT44((int)fStack_13fc,(int)local_1400);
          uStack_1e58 = CONCAT44((int)fStack_13f4,(int)fStack_13f8);
          uStack_1e50 = CONCAT44((int)fStack_13ec,(int)fStack_13f0);
          uStack_1e48 = CONCAT44((int)fStack_13e4,(int)fStack_13e8);
          auVar58._8_8_ = uStack_1e58;
          auVar58._0_8_ = local_1e60;
          auVar57._8_8_ = 0x7f0000007f;
          auVar57._0_8_ = 0x7f0000007f;
          auVar17 = vpaddd_avx(auVar58,auVar57);
          auVar19._8_8_ = uStack_1e48;
          auVar19._0_8_ = uStack_1e50;
          auVar18._8_8_ = 0x7f0000007f;
          auVar18._0_8_ = 0x7f0000007f;
          auVar18 = vpaddd_avx(auVar19,auVar18);
          auVar17 = vpslld_avx(auVar17,ZEXT416(0x17));
          auVar18 = vpslld_avx(auVar18,ZEXT416(0x17));
          local_1760 = auVar17._0_4_;
          fStack_175c = auVar17._4_4_;
          fStack_1758 = auVar17._8_4_;
          fStack_1754 = auVar17._12_4_;
          fStack_1750 = auVar18._0_4_;
          fStack_174c = auVar18._4_4_;
          fStack_1748 = auVar18._8_4_;
          local_2020 = auVar15._0_4_;
          fStack_201c = auVar15._4_4_;
          fStack_2018 = auVar15._8_4_;
          fStack_2014 = auVar15._12_4_;
          fStack_2010 = auVar16._0_4_;
          fStack_200c = auVar16._4_4_;
          fStack_2008 = auVar16._8_4_;
          fStack_2004 = auVar16._12_4_;
          auVar48._16_8_ = uStack_1fd0;
          auVar48._0_16_ = auVar15;
          auVar48._24_8_ = uStack_1fc8;
          auVar47._4_4_ =
               fStack_201c +
               (((((fStack_16fc * (fStack_16fc * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_16fc + 0.041665796) * fStack_16fc + 0.16666666) * fStack_16fc + 0.5) *
                fStack_16fc * fStack_16fc + fStack_16fc + 1.0) * fStack_175c;
          auVar47._0_4_ =
               local_2020 +
               (((((local_1700 * (local_1700 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   local_1700 + 0.041665796) * local_1700 + 0.16666666) * local_1700 + 0.5) *
                local_1700 * local_1700 + local_1700 + 1.0) * local_1760;
          auVar47._8_4_ =
               fStack_2018 +
               (((((fStack_16f8 * (fStack_16f8 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_16f8 + 0.041665796) * fStack_16f8 + 0.16666666) * fStack_16f8 + 0.5) *
                fStack_16f8 * fStack_16f8 + fStack_16f8 + 1.0) * fStack_1758;
          auVar47._12_4_ =
               fStack_2014 +
               (((((fStack_16f4 * (fStack_16f4 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_16f4 + 0.041665796) * fStack_16f4 + 0.16666666) * fStack_16f4 + 0.5) *
                fStack_16f4 * fStack_16f4 + fStack_16f4 + 1.0) * fStack_1754;
          auVar47._16_4_ =
               fStack_2010 +
               (((((fStack_16f0 * (fStack_16f0 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_16f0 + 0.041665796) * fStack_16f0 + 0.16666666) * fStack_16f0 + 0.5) *
                fStack_16f0 * fStack_16f0 + fStack_16f0 + 1.0) * fStack_1750;
          auVar47._20_4_ =
               fStack_200c +
               (((((fStack_16ec * (fStack_16ec * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_16ec + 0.041665796) * fStack_16ec + 0.16666666) * fStack_16ec + 0.5) *
                fStack_16ec * fStack_16ec + fStack_16ec + 1.0) * fStack_174c;
          auVar47._24_4_ =
               fStack_2008 +
               (((((fStack_16e8 * (fStack_16e8 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_16e8 + 0.041665796) * fStack_16e8 + 0.16666666) * fStack_16e8 + 0.5) *
                fStack_16e8 * fStack_16e8 + fStack_16e8 + 1.0) * fStack_1748;
          auVar47._28_4_ = fStack_2004 + fStack_16e4 + fStack_16e4 + 1.0;
          auVar21 = vdivps_avx(auVar48,auVar47);
          local_2120 = auVar21._0_4_;
          fStack_211c = auVar21._4_4_;
          fStack_2118 = auVar21._8_4_;
          fStack_2114 = auVar21._12_4_;
          fStack_2110 = auVar21._16_4_;
          fStack_210c = auVar21._20_4_;
          fStack_2108 = auVar21._24_4_;
          auVar53._4_4_ = fStack_211c * fStack_20fc;
          auVar53._0_4_ = local_2120 * local_2100;
          auVar53._8_4_ = fStack_2118 * fStack_20f8;
          auVar53._12_4_ = fStack_2114 * fStack_20f4;
          auVar53._16_4_ = fStack_2110 * fStack_20f0;
          auVar53._20_4_ = fStack_210c * fStack_20ec;
          auVar53._24_4_ = fStack_2108 * fStack_20e8;
          auVar53._28_4_ = auVar21._28_4_;
          auVar52._16_8_ = uStack_1f90;
          auVar52._0_16_ = auVar14;
          auVar52._24_8_ = uStack_1f88;
          auVar21 = vsubps_avx(auVar53,auVar52);
          uStack_4124 = (undefined4)((ulong)uStack_5388 >> 0x20);
          local_4160 = auVar21._0_4_;
          fStack_415c = auVar21._4_4_;
          fStack_4158 = auVar21._8_4_;
          fStack_4154 = auVar21._12_4_;
          fStack_4150 = auVar21._16_4_;
          fStack_414c = auVar21._20_4_;
          fStack_4148 = auVar21._24_4_;
          local_4a00._4_4_ = fStack_413c * fStack_415c;
          local_4a00._0_4_ = local_4140 * local_4160;
          uStack_49f8._0_4_ = fStack_4138 * fStack_4158;
          uStack_49f8._4_4_ = fStack_4134 * fStack_4154;
          uStack_49f0._0_4_ = fStack_4130 * fStack_4150;
          uStack_49f0._4_4_ = fStack_412c * fStack_414c;
          uStack_49e8._0_4_ = fStack_4128 * fStack_4148;
          uStack_49e8._4_4_ = uStack_4124;
          break;
        case 6:
          uVar10 = *(uint *)*plVar24;
          auVar14 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar10),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar10),0x30);
          auVar15 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(uVar10),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(uVar10),0x30);
          uVar10 = *(uint *)(*plVar24 + 4);
          auVar16 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(uVar10),0x20);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(uVar10),0x30);
          auVar17 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
          auVar17 = vinsertps_avx(auVar17,ZEXT416(uVar10),0x20);
          auVar17 = vinsertps_avx(auVar17,ZEXT416(uVar10),0x30);
          auVar18 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x20);
          auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x30);
          auVar19 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3f800000),0x20);
          auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3f800000),0x30);
          uStack_3e90 = auVar19._0_8_;
          uStack_3e88 = auVar19._8_8_;
          local_3fc0 = auVar14._0_4_;
          fStack_3fbc = auVar14._4_4_;
          fStack_3fb8 = auVar14._8_4_;
          fStack_3fb4 = auVar14._12_4_;
          fStack_3fb0 = auVar15._0_4_;
          fStack_3fac = auVar15._4_4_;
          fStack_3fa8 = auVar15._8_4_;
          fStack_3fa4 = auVar15._12_4_;
          local_4000 = auVar16._0_4_;
          fStack_3ffc = auVar16._4_4_;
          fStack_3ff8 = auVar16._8_4_;
          fStack_3ff4 = auVar16._12_4_;
          fStack_3ff0 = auVar17._0_4_;
          fStack_3fec = auVar17._4_4_;
          fStack_3fe8 = auVar17._8_4_;
          fStack_3fe4 = auVar17._12_4_;
          local_40e0._4_4_ = fStack_413c * fStack_3fbc + fStack_3ffc;
          local_40e0._0_4_ = local_4140 * local_3fc0 + local_4000;
          fStack_40d8 = fStack_4138 * fStack_3fb8 + fStack_3ff8;
          fStack_40d4 = fStack_4134 * fStack_3fb4 + fStack_3ff4;
          uStack_40d0._0_4_ = fStack_4130 * fStack_3fb0 + fStack_3ff0;
          uStack_40d0._4_4_ = fStack_412c * fStack_3fac + fStack_3fec;
          uStack_40c8._0_4_ = fStack_4128 * fStack_3fa8 + fStack_3fe8;
          uStack_40c8._4_4_ = fStack_3fa4 + fStack_3fe4;
          auVar21 = _local_40e0;
          uStack_40c8 = auVar21._24_8_;
          auVar21._16_8_ = uStack_40d0;
          auVar21._0_16_ = _local_40e0;
          auVar21._24_8_ = uStack_40c8;
          auVar21 = vmaxps_avx(auVar21,ZEXT832(0));
          auVar20._16_8_ = uStack_3e90;
          auVar20._0_16_ = auVar18;
          auVar20._24_8_ = uStack_3e88;
          auVar21 = vminps_avx(auVar21,auVar20);
          local_3f60 = auVar21._0_4_;
          fStack_3f5c = auVar21._4_4_;
          fStack_3f58 = auVar21._8_4_;
          fStack_3f54 = auVar21._12_4_;
          fStack_3f50 = auVar21._16_4_;
          fStack_3f4c = auVar21._20_4_;
          fStack_3f48 = auVar21._24_4_;
          uStack_3f44 = auVar21._28_4_;
          local_4a00._4_4_ = fStack_3f5c * fStack_413c;
          local_4a00._0_4_ = local_3f60 * local_4140;
          uStack_49f8._0_4_ = fStack_3f58 * fStack_4138;
          uStack_49f8._4_4_ = fStack_3f54 * fStack_4134;
          uStack_49f0._0_4_ = fStack_3f50 * fStack_4130;
          uStack_49f0._4_4_ = fStack_3f4c * fStack_412c;
          uStack_49e8._0_4_ = fStack_3f48 * fStack_4128;
          uStack_49e8._4_4_ = uStack_3f44;
          break;
        default:
          uStack_49f8 = uStack_5398;
          local_4a00 = (undefined1  [8])local_53a0;
          uStack_49f0 = uStack_5390;
          uStack_49e8 = uStack_5388;
        }
        *local_52f8 = _local_4a00;
        local_52f8 = local_52f8 + 1;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m256 _sum = _mm256_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm256_loadu_ps(bias_data_ptr + p * 8);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            const float* sptr = m.row(sy) + sx * 8;

                            int k = (y * kernel_w + x) * 64;

                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);
                            __m256 _w0 = _mm256_load_ps(kptr + k);
                            __m256 _w1 = _mm256_load_ps(kptr + k + 8);
                            __m256 _w2 = _mm256_load_ps(kptr + k + 16);
                            __m256 _w3 = _mm256_load_ps(kptr + k + 24);
                            __m256 _w4 = _mm256_load_ps(kptr + k + 32);
                            __m256 _w5 = _mm256_load_ps(kptr + k + 40);
                            __m256 _w6 = _mm256_load_ps(kptr + k + 48);
                            __m256 _w7 = _mm256_load_ps(kptr + k + 56);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);
                            _sum = _mm256_comp_fmadd_ps(_val4, _w4, _sum);
                            _sum = _mm256_comp_fmadd_ps(_val5, _w5, _sum);
                            _sum = _mm256_comp_fmadd_ps(_val6, _w6, _sum);
                            _sum = _mm256_comp_fmadd_ps(_val7, _w7, _sum);
                        }
                    }

                    kptr += maxk * 64;
                }

                _sum = activation_avx(_sum, activation_type, activation_params);

                _mm256_storeu_ps(outptr, _sum);
                outptr += 8;
            }
        }
    }
}